

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.hpp
# Opt level: O0

SubcaseBasePtr
deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::PlainGatherUintCubeArray>(void)

{
  TGBase *pTVar1;
  PlainGatherUintCubeArray *this;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<deqp::SubcaseBase> *in_RDI;
  SubcaseBasePtr SVar2;
  
  this = (PlainGatherUintCubeArray *)operator_new(0x60);
  (this->super_GatherBase).rbo = 0;
  (this->super_GatherBase).program = 0;
  (this->super_GatherBase).vao = 0;
  (this->super_GatherBase).vbo = 0;
  pTVar1 = &(this->super_GatherBase).super_TGBase;
  (pTVar1->g_color_eps).m_data[2] = 0.0;
  (pTVar1->g_color_eps).m_data[3] = 0.0;
  (this->super_GatherBase).tex = 0;
  (this->super_GatherBase).fbo = 0;
  (this->super_GatherBase).super_TGBase.pixelFormat = (PixelFormat *)0x0;
  (this->super_GatherBase).super_TGBase.g_color_eps.m_data[0] = 0.0;
  (this->super_GatherBase).super_TGBase.g_color_eps.m_data[1] = 0.0;
  (this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.m_context = (Context *)0x0
  ;
  (this->super_GatherBase).super_TGBase.renderTarget = (RenderTarget *)0x0;
  (this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.super_CallLogWrapper.m_log
       = (TestLog *)0x0;
  *(undefined8 *)
   &(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.super_CallLogWrapper.
    m_enableLog = 0;
  (this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper =
       (_func_int **)0x0;
  (this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.super_CallLogWrapper.m_gl
       = (Functions *)0x0;
  gl4cts::anon_unknown_0::PlainGatherUintCubeArray::PlainGatherUintCubeArray(this);
  de::SharedPtr<deqp::SubcaseBase>::SharedPtr(in_RDI,(SubcaseBase *)this);
  SVar2.m_state = extraout_RDX;
  SVar2.m_ptr = (SubcaseBase *)in_RDI;
  return SVar2;
}

Assistant:

static SubcaseBase::SubcaseBasePtr Create()
	{
		return SubcaseBase::SubcaseBasePtr(new Type());
	}